

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZCompMesh> * __thiscall
TPZAutoPointer<TPZCompMesh>::operator=
          (TPZAutoPointer<TPZCompMesh> *this,TPZMultiphysicsCompMesh *other)

{
  bool bVar1;
  TPZReference *pTVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      Release(this);
    }
  }
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = &other->super_TPZCompMesh;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  this->fRef = pTVar2;
  return this;
}

Assistant:

TPZAutoPointer &operator=(T2 *other)
    {
        if constexpr (!std::is_base_of_v<T, T2>){
            static_assert(!sizeof(T2*),"Incompatible types when creating TPZAutoPointer");
        }
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(other);
        return *this;
    }